

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadDataSection(WasmBinaryReader *this)

{
  WasmNode ie;
  bool bVar1;
  uint count;
  uint32 uVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *pFVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  WasmDataSegment *this_00;
  TrackAllocData local_78;
  WasmDataSegment *local_50;
  WasmDataSegment *dseg;
  undefined1 auStack_40 [4];
  uint32 dataByteLen;
  WasmNode initExpr;
  uint32 index;
  uint32 i;
  uint32 numSegments;
  uint32 len;
  WasmBinaryReader *this_local;
  
  i = 0;
  _numSegments = this;
  count = LEB128<unsigned_int,32u>(this,&i);
  uVar2 = Limits::GetMaxDataSegments();
  if (uVar2 < count) {
    ThrowDecodingError(this,L"Too many data segments");
  }
  if (count != 0) {
    Js::WebAssemblyModule::AllocateDataSegs(this->m_module,count);
  }
  initExpr.field_1._20_4_ = 0;
  do {
    if (count <= (uint)initExpr.field_1._20_4_) {
      return;
    }
    initExpr.field_1.brTable.defaultTarget = LEB128<unsigned_int,32u>(this,&i);
    if ((initExpr.field_1.brTable.defaultTarget != 0) ||
       ((bVar1 = Js::WebAssemblyModule::HasMemory(this->m_module), !bVar1 &&
        (bVar1 = Js::WebAssemblyModule::HasMemoryImport(this->m_module), !bVar1)))) {
      ThrowDecodingError(this,L"Unknown memory index %u",
                         (ulong)initExpr.field_1.brTable.defaultTarget);
    }
    pFVar3 = GetFunctionBody(this);
    if (pFVar3 == (FunctionBody *)0x0) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
      if (bVar1) goto LAB_0160b62e;
    }
    else {
      pFVar3 = GetFunctionBody(this);
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar3);
      pFVar3 = GetFunctionBody(this);
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar3);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
      if (bVar1) {
LAB_0160b62e:
        Output::Print(L"Data Segment #%u",(ulong)(uint)initExpr.field_1._20_4_);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    ReadInitExpr((WasmNode *)auStack_40,this,true);
    dseg._4_4_ = LEB128<unsigned_int,32u>(this,&i);
    pAVar4 = &this->m_alloc->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,(type_info *)&WasmDataSegment::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
               ,0x3fc);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_78);
    this_00 = (WasmDataSegment *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar4,0x3f67b0)
    ;
    ie.field_1.block = (WasmBlock)initExpr._0_8_;
    ie.op = auStack_40._0_2_;
    ie._2_6_ = stack0xffffffffffffffc2;
    ie.field_1._8_8_ = initExpr.field_1.block;
    ie.field_1._16_8_ = initExpr.field_1.brTable.targetTable;
    WasmDataSegment::WasmDataSegment(this_00,this->m_alloc,ie,dseg._4_4_,this->m_pc);
    local_50 = this_00;
    CheckBytesLeft(this,dseg._4_4_);
    this->m_pc = this->m_pc + dseg._4_4_;
    Js::WebAssemblyModule::SetDataSeg(this->m_module,local_50,initExpr.field_1._20_4_);
    initExpr.field_1._20_4_ = initExpr.field_1._20_4_ + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadDataSection()
{
    uint32 len = 0;
    const uint32 numSegments = LEB128(len);
    if (numSegments > Limits::GetMaxDataSegments())
    {
        ThrowDecodingError(_u("Too many data segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateDataSegs(numSegments);
    }

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(len);
        if (index != 0 || !(m_module->HasMemory() || m_module->HasMemoryImport()))
        {
            ThrowDecodingError(_u("Unknown memory index %u"), index);
        }
        TRACE_WASM_DECODER(_u("Data Segment #%u"), i);
        WasmNode initExpr = ReadInitExpr(true);
        uint32 dataByteLen = LEB128(len);

        WasmDataSegment* dseg = Anew(m_alloc, WasmDataSegment, m_alloc, initExpr, dataByteLen, m_pc);
        CheckBytesLeft(dataByteLen);
        m_pc += dataByteLen;
        m_module->SetDataSeg(dseg, i);
    }
}